

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int SetRudderThrustersPololu(POLOLU *pPololu,double angle,double urt,double ult)

{
  int iVar1;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  double local_148;
  double local_138;
  double local_128;
  double local_110;
  double local_108;
  double angletmp;
  int pws [24];
  int selectedchannels [24];
  double ult_local;
  double urt_local;
  double angle_local;
  POLOLU *pPololu_local;
  
  memset(pws + 0x16,0,0x60);
  memset(&angletmp,0,0x60);
  if (angle < 0.0) {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_128 = pPololu->MaxAngle;
    }
    else {
      local_128 = pPololu->MinAngle;
    }
    local_128 = ABS(local_128);
    local_110 = pPololu->MidAngle + (angle * (pPololu->MidAngle - pPololu->MinAngle)) / local_128;
  }
  else {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_108 = pPololu->MaxAngle;
    }
    else {
      local_108 = pPololu->MinAngle;
    }
    local_108 = ABS(local_108);
    local_110 = pPololu->MidAngle + (angle * (pPololu->MaxAngle - pPololu->MidAngle)) / local_108;
  }
  if (local_110 < 0.0) {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_148 = pPololu->MaxAngle;
    }
    else {
      local_148 = pPololu->MinAngle;
    }
    local_148 = ABS(local_148);
    pws[(long)pPololu->rudderchan + -2] = (int)((local_110 * 500.0) / local_148) + 0x5dc;
  }
  else {
    if (ABS(pPololu->MinAngle) <= ABS(pPololu->MaxAngle)) {
      local_138 = pPololu->MaxAngle;
    }
    else {
      local_138 = pPololu->MinAngle;
    }
    local_138 = ABS(local_138);
    pws[(long)pPololu->rudderchan + -2] = (int)((local_110 * 500.0) / local_138) + 0x5dc;
  }
  pws[(long)pPololu->rightthrusterchan + -2] = (int)((urt * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pPololu->leftthrusterchan + -2] = (int)((ult * 1000.0) / 2.0) + 0x5dc;
  if (pws[(long)pPololu->rudderchan + -2] < 2000) {
    local_14c = pws[(long)pPololu->rudderchan + -2];
  }
  else {
    local_14c = 2000;
  }
  if (local_14c < 0x3e9) {
    local_154 = 1000;
  }
  else {
    if (pws[(long)pPololu->rudderchan + -2] < 2000) {
      local_150 = pws[(long)pPololu->rudderchan + -2];
    }
    else {
      local_150 = 2000;
    }
    local_154 = local_150;
  }
  pws[(long)pPololu->rudderchan + -2] = local_154;
  if (pws[(long)pPololu->rightthrusterchan + -2] < 2000) {
    local_158 = pws[(long)pPololu->rightthrusterchan + -2];
  }
  else {
    local_158 = 2000;
  }
  if (local_158 < 0x3e9) {
    local_160 = 1000;
  }
  else {
    if (pws[(long)pPololu->rightthrusterchan + -2] < 2000) {
      local_15c = pws[(long)pPololu->rightthrusterchan + -2];
    }
    else {
      local_15c = 2000;
    }
    local_160 = local_15c;
  }
  pws[(long)pPololu->rightthrusterchan + -2] = local_160;
  if (pws[(long)pPololu->leftthrusterchan + -2] < 2000) {
    local_164 = pws[(long)pPololu->leftthrusterchan + -2];
  }
  else {
    local_164 = 2000;
  }
  if (local_164 < 0x3e9) {
    local_16c = 1000;
  }
  else {
    if (pws[(long)pPololu->leftthrusterchan + -2] < 2000) {
      local_168 = pws[(long)pPololu->leftthrusterchan + -2];
    }
    else {
      local_168 = 2000;
    }
    local_16c = local_168;
  }
  pws[(long)pPololu->leftthrusterchan + -2] = local_16c;
  pws[(long)pPololu->rudderchan + 0x16] = 1;
  pws[(long)pPololu->rightthrusterchan + 0x16] = 1;
  pws[(long)pPololu->leftthrusterchan + 0x16] = 1;
  iVar1 = SetAllPWMsPololu(pPololu,pws + 0x16,(int *)&angletmp);
  return iVar1;
}

Assistant:

inline int SetRudderThrustersPololu(POLOLU* pPololu, double angle, double urt, double ult)
{
	int selectedchannels[NB_CHANNELS_PWM_POLOLU];
	int pws[NB_CHANNELS_PWM_POLOLU];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into Pololu pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pPololu->MidAngle+angle*(pPololu->MaxAngle-pPololu->MidAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)): pPololu->MidAngle+angle*(pPololu->MidAngle-pPololu->MinAngle)/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle));
	//angletmp = angle >= 0? pPololu->MidAngle+urudder*(pPololu->MaxAngle-pPololu->MidAngle): pPololu->MidAngle+urudder*(pPololu->MidAngle-pPololu->MinAngle);
	if (angletmp >= 0)
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
	else
		pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angletmp*(DEFAULT_MID_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
			/max(fabs(pPololu->MinAngle), fabs(pPololu->MaxAngle)));
#else
	pws[pPololu->rudderchan] = DEFAULT_MID_PW_POLOLU+(int)(angle*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)
		/(pPololu->MaxAngle-pPololu->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into Pololu pulse width (in us).
	pws[pPololu->rightthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(urt*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);
	pws[pPololu->leftthrusterchan] = DEFAULT_MID_PW_POLOLU+(int)(ult*(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU)/2.0);

	pws[pPololu->rudderchan] = max(min(pws[pPololu->rudderchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->rightthrusterchan] = max(min(pws[pPololu->rightthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);
	pws[pPololu->leftthrusterchan] = max(min(pws[pPololu->leftthrusterchan], DEFAULT_MAX_PW_POLOLU), DEFAULT_MIN_PW_POLOLU);

	selectedchannels[pPololu->rudderchan] = 1;
	selectedchannels[pPololu->rightthrusterchan] = 1;
	selectedchannels[pPololu->leftthrusterchan] = 1;

	return SetAllPWMsPololu(pPololu, selectedchannels, pws);
}